

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O2

bool __thiscall
despot::option::PrintUsageImplementation::LinePartIterator::nextRow(LinePartIterator *this)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar2 = this->ptr;
  if (this->ptr == (char *)0x0) {
    this->ptr = this->rowstart;
    this->col = -1;
    this->target_line_in_block = 0;
    this->len = 0;
    this->screenlen = 0;
    this->max_line_in_block = 0;
    this->line_in_block = 0;
    this->hit_target_line = true;
    return this->rowstart != (char *)0x0;
  }
  while( true ) {
    pcVar1 = pcVar2 + 1;
    if (*pcVar2 == '\0') break;
    if (*pcVar2 == '\n') goto LAB_0016e0da;
    this->ptr = pcVar1;
    pcVar2 = pcVar1;
  }
  pcVar1 = this->rowdesc[1].help;
  if (pcVar1 == (char *)0x0) {
    return false;
  }
  this->rowdesc = this->rowdesc + 1;
LAB_0016e0da:
  this->rowstart = pcVar1;
  this->ptr = pcVar1;
  this->col = -1;
  this->target_line_in_block = 0;
  this->len = 0;
  this->screenlen = 0;
  this->max_line_in_block = 0;
  this->line_in_block = 0;
  this->hit_target_line = true;
  return true;
}

Assistant:

bool nextRow() {
			if (ptr == 0) {
				restartRow();
				return rowstart != 0;
			}

			while (*ptr != 0 && *ptr != '\n')
				++ptr;

			if (*ptr == 0) {
				if ((rowdesc + 1)->help == 0) // table break
					return false;

				++rowdesc;
				rowstart = rowdesc->help;
			} else // if (*ptr == '\n')
			{
				rowstart = ptr + 1;
			}

			restartRow();
			return true;
		}